

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>::insert
          (storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag> *this,
          local_context *ctx,bit_array *x,size_t hash,double value,double duration,long loop)

{
  result_type rVar1;
  string_view fmt;
  string_view fmt_00;
  undefined4 uStack_48;
  int id_to_delete;
  long loop_local;
  double duration_local;
  double value_local;
  size_t hash_local;
  
  fmt._M_str = (char *)&value_local;
  fmt._M_len = (size_t)"- insert solution {} (hash: {}) {}s in {} loops\n";
  loop_local = loop;
  duration_local = duration;
  value_local = value;
  hash_local = hash;
  to_log<double,unsigned_long,double,long>
            (_stdout,(FILE *)0x5,0x30,fmt,(double *)&hash_local,(unsigned_long *)&duration_local,
             (double *)&loop_local,(long *)CONCAT44(id_to_delete,uStack_48));
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (&ctx->bad_solution_choose,&ctx->rng,&(ctx->bad_solution_choose)._M_param);
  id_to_delete = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[rVar1];
  fmt_00._M_str = (char *)&id_to_delete;
  fmt_00._M_len = (size_t)"- delete {} ({})\n";
  to_log<int,double>(_stdout,(FILE *)0x5,0x11,fmt_00,
                     (int *)&(this->m_data).
                             super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[id_to_delete].value,
                     (double *)CONCAT44(id_to_delete,uStack_48));
  replace_result(this,id_to_delete,x,value_local,duration_local,hash_local,loop_local,0);
  sort(this);
  return;
}

Assistant:

void insert(local_context& ctx,
                const bit_array& x,
                const std::size_t hash,
                const double value,
                const double duration,
                const long int loop) noexcept
    {
        to_log(stdout,
               5u,
               "- insert solution {} (hash: {}) {}s in {} loops\n",
               value,
               hash,
               duration,
               loop);

        int id_to_delete = m_indices[choose_a_bad_solution(ctx)];

        to_log(stdout,
               5u,
               "- delete {} ({})\n",
               id_to_delete,
               m_data[id_to_delete].value);

        replace_result(id_to_delete, x, value, duration, hash, loop, 0);

        sort();
    }